

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O3

int ParseSighashString(UniValue *sighash)

{
  string *sighash_00;
  T *pTVar1;
  UniValue *__return_storage_ptr__;
  int iVar2;
  long in_FS_OFFSET;
  Result<int> result;
  bilingual_str local_a0;
  _Variant_storage<false,_bilingual_str,_int> local_60;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (sighash->typ == VNULL) {
    iVar2 = 0;
  }
  else {
    sighash_00 = UniValue::get_str_abi_cxx11_(sighash);
    SighashFromStr((Result<int> *)&local_60,sighash_00);
    if (local_60._M_index != '\x01') {
      __return_storage_ptr__ = (UniValue *)__cxa_allocate_exception(0x58);
      util::ErrorString<int>(&local_a0,(Result<int> *)&local_60);
      JSONRPCError(__return_storage_ptr__,-8,&local_a0.original);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        __cxa_throw(__return_storage_ptr__,&UniValue::typeinfo,UniValue::~UniValue);
      }
      goto LAB_00372e1a;
    }
    pTVar1 = util::Result<int>::value((Result<int> *)&local_60);
    iVar2 = *pTVar1;
    std::__detail::__variant::_Variant_storage<false,_bilingual_str,_int>::~_Variant_storage
              (&local_60);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return iVar2;
  }
LAB_00372e1a:
  __stack_chk_fail();
}

Assistant:

int ParseSighashString(const UniValue& sighash)
{
    if (sighash.isNull()) {
        return SIGHASH_DEFAULT;
    }
    const auto result{SighashFromStr(sighash.get_str())};
    if (!result) {
        throw JSONRPCError(RPC_INVALID_PARAMETER, util::ErrorString(result).original);
    }
    return result.value();
}